

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptrlist.c
# Opt level: O0

void raviX_ptrlist_iter_insert(PtrListIterator *self,void *newitem)

{
  PtrList *pPVar1;
  void **ppvVar2;
  PtrList **local_28;
  void **__last;
  void **__this;
  void *newitem_local;
  PtrListIterator *self_local;
  
  if (-1 < self->__nr) {
    raviX_ptrlist_iter_split_current(self);
    ppvVar2 = self->__list->list_ + self->__nr;
    for (local_28 = (PtrList **)
                    (self->__list->list_ + (long)(int)(short)(char)*(undefined2 *)self->__list + -1)
        ; ppvVar2 <= local_28; local_28 = local_28 + -1) {
      local_28[1] = (PtrList *)*local_28;
    }
    *ppvVar2 = newitem;
    pPVar1 = self->__list;
    *(ushort *)pPVar1 = *(ushort *)pPVar1 & 0xff00 | (short)(char)*(ushort *)pPVar1 + 1U & 0xff;
    return;
  }
  __assert_fail("self->__nr >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/ptrlist.c"
                ,0x85,"void raviX_ptrlist_iter_insert(PtrListIterator *, void *)");
}

Assistant:

void raviX_ptrlist_iter_insert(PtrListIterator *self, void *newitem)
{
	assert(self->__nr >= 0);
	raviX_ptrlist_iter_split_current(self);
	void **__this = self->__list->list_ + self->__nr;
	void **__last = self->__list->list_ + self->__list->nr_ - 1;
	while (__last >= __this) {
		__last[1] = __last[0];
		__last--;
	}
	*__this = newitem;
	self->__list->nr_++;
}